

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O1

bool __thiscall
GF2::MI<136UL,_GF2::MOGrevlex<136UL>_>::ReduceClassic
          (MI<136UL,_GF2::MOGrevlex<136UL>_> *this,MP<136UL,_GF2::MOGrevlex<136UL>_> *polyRight)

{
  size_t sVar1;
  list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *plVar2;
  list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *plVar3;
  _List_node_base **m2;
  list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
  *plVar4;
  ulong uVar5;
  int iVar6;
  size_t pos;
  ulong uVar7;
  long lVar8;
  _List_node_base *p_Var9;
  bool bVar10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  MP<136UL,_GF2::MOGrevlex<136UL>_> poly;
  undefined8 local_88;
  undefined8 uStack_80;
  _List_node_base *local_78;
  MM<136UL> local_68;
  list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *local_50;
  list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *local_48;
  undefined8 local_40;
  
  local_40 = 0;
  p_Var9 = (polyRight->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  local_50 = (list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *)&local_50;
  local_48 = (list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *)&local_50;
  if (p_Var9 == (_List_node_base *)polyRight) {
    bVar10 = false;
    plVar3 = (list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *)&local_50;
  }
  else {
    bVar10 = false;
    do {
      p_Var11 = (this->
                super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                ).
                super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var12 = p_Var11;
      if (p_Var11 != (_List_node_base *)this) {
        m2 = &p_Var9[1]._M_next;
LAB_00126722:
        iVar6 = MOGrevlex<136UL>::Compare
                          ((MOGrevlex<136UL> *)&this->field_0x18,
                           (MM<136UL> *)
                           (*(size_t *)
                             &((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                                *)(p_Var11 + 1))->
                              super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                           + 0x10),(MM<136UL> *)m2);
        p_Var12 = (_List_node_base *)this;
        if (iVar6 < 1) {
          plVar4 = (list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                    *)(p_Var11 + 1);
          if ((*(ulong *)(*(size_t *)
                           &plVar4->
                            super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                         + 0x10) & ~(ulong)*m2) != 0) goto LAB_0012677b;
          uVar5 = 0;
          do {
            uVar7 = uVar5;
            if (uVar7 == 2) {
              uVar7 = 2;
              break;
            }
            uVar5 = uVar7 + 1;
          } while ((*(ulong *)(*(size_t *)
                                &plVar4->
                                 super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                               + 0x18 + uVar7 * 8) &
                   ~*(ulong *)((long)(p_Var9 + 1) + 8U + uVar7 * 8)) == 0);
          if (uVar7 < 2) goto LAB_0012677b;
          sVar1 = *(size_t *)
                   &plVar4->
                    super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
          ;
          local_78 = p_Var9[2]._M_next;
          local_88 = *m2;
          uStack_80 = *(undefined8 *)((long)(p_Var9 + 1) + 8);
          lVar8 = 0;
          do {
            (&local_88)[lVar8] = (&local_88)[lVar8] & ~*(ulong *)(sVar1 + 0x10 + lVar8 * 8);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          local_68.super_WW<136UL>._words[2] = (word)local_78;
          local_68.super_WW<136UL>._words[0]._0_4_ = (undefined4)local_88;
          local_68.super_WW<136UL>._words[0]._4_4_ = local_88._4_4_;
          local_68.super_WW<136UL>._words[1]._0_4_ = (undefined4)uStack_80;
          local_68.super_WW<136UL>._words[1]._4_4_ = uStack_80._4_4_;
          if ((list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *)plVar4 !=
              (list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *)&local_50) {
            std::__cxx11::list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>>::
            _M_assign_dispatch<std::_List_const_iterator<GF2::MM<136ul>>>
                      ((list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *)&local_50,
                       *(size_t *)
                        &plVar4->
                         super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                      );
          }
          MP<136UL,_GF2::MOGrevlex<136UL>_>::operator*=
                    ((MP<136UL,_GF2::MOGrevlex<136UL>_> *)&local_50,&local_68);
          MP<136UL,_GF2::MOGrevlex<136UL>_>::SymDiffSplice
                    (polyRight,(MP<136UL,_GF2::MOGrevlex<136UL>_> *)&local_50);
          p_Var9 = (polyRight->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
                   super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl.
                   _M_node.super__List_node_base._M_next;
          bVar10 = true;
          p_Var12 = p_Var11;
        }
      }
LAB_0012678c:
      if (p_Var12 == (_List_node_base *)this) {
        p_Var9 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var9->_M_next)->
                 super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl._M_node
                 .super__List_node_base._M_next;
      }
      plVar3 = local_50;
    } while (p_Var9 != (_List_node_base *)polyRight);
  }
  while (plVar3 != (list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *)&local_50) {
    plVar2 = *(list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> **)plVar3;
    operator_delete(plVar3,0x28);
    plVar3 = plVar2;
  }
  return bVar10;
LAB_0012677b:
  p_Var11 = (((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
               *)&p_Var11->_M_next)->
            super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  p_Var12 = p_Var11;
  if (p_Var11 == (_List_node_base *)this) goto LAB_0012678c;
  goto LAB_00126722;
}

Assistant:

bool ReduceClassic(MP<_n, _O>& polyRight) const
	{	
		assert(IsConsistent(polyRight));
		bool changed = false;
		MP<_n, _O> poly(_order);
		// двигаемся от старших мономов polyRight к младшим
		auto iterMon = polyRight.begin();
		while (iterMon != polyRight.end())
		{
			// двигаемся от младших многочленов системы к старшим
			const_iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// прекращаем заведомо нерезультативные итерации
				if (_order.Compare(iterPoly->LM(), *iterMon) > 0)
				{
					iterPoly = end();
					break;
				}
				// делим при возможности
				else if (iterPoly->LM() | *iterMon)
				{
					changed = true;
					(poly = *iterPoly) *= *iterMon / iterPoly->LM();
					polyRight.SymDiffSplice(poly);
					iterMon = polyRight.begin();
					break;
				}
			}
			if (iterPoly == end())
				++iterMon;
		}
		return changed;
	}